

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

void __thiscall
CoreML::Specification::ConvolutionLayerParams::_internal_add_stride
          (ConvolutionLayerParams *this,uint64_t value)

{
  RepeatedField<unsigned_long> *this_00;
  uint uVar1;
  uint uVar2;
  unsigned_long *puVar3;
  unsigned_long tmp;
  
  this_00 = &this->stride_;
  uVar1 = (this->stride_).current_size_;
  uVar2 = (this->stride_).total_size_;
  if (uVar1 == uVar2) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar2 + 1);
  }
  puVar3 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  puVar3[uVar1] = value;
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void ConvolutionLayerParams::_internal_add_stride(uint64_t value) {
  stride_.Add(value);
}